

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemInformation.cxx
# Opt level: O3

string * __thiscall
cmsys::SystemInformation::GetOSDescription_abi_cxx11_
          (string *__return_storage_ptr__,SystemInformation *this)

{
  char *pcVar1;
  size_t sVar2;
  ostringstream oss;
  undefined1 auStack_198 [8];
  long local_190 [14];
  ios_base local_120 [264];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
  pcVar1 = (this->Implementation->OSName)._M_dataplus._M_p;
  if (pcVar1 == (char *)0x0) {
    std::ios::clear((int)auStack_198 + (int)*(undefined8 *)(local_190[0] + -0x18) + 8);
  }
  else {
    sVar2 = strlen(pcVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,pcVar1,sVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190," ",1);
  pcVar1 = (this->Implementation->OSRelease)._M_dataplus._M_p;
  if (pcVar1 == (char *)0x0) {
    std::ios::clear((int)auStack_198 + (int)*(undefined8 *)(local_190[0] + -0x18) + 8);
  }
  else {
    sVar2 = strlen(pcVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,pcVar1,sVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190," ",1);
  pcVar1 = (this->Implementation->OSVersion)._M_dataplus._M_p;
  if (pcVar1 == (char *)0x0) {
    std::ios::clear((int)auStack_198 + (int)*(undefined8 *)(local_190[0] + -0x18) + 8);
  }
  else {
    sVar2 = strlen(pcVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,pcVar1,sVar2);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

std::string SystemInformation::GetOSDescription()
{
  std::ostringstream oss;
  oss << this->GetOSName() << " " << this->GetOSRelease() << " "
      << this->GetOSVersion();

  return oss.str();
}